

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int GmfGetLin(int64_t MshIdx,int KwdCod,...)

{
  __jmp_buf_tag *__env;
  char cVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  void **ppvVar7;
  long lVar8;
  uint uVar9;
  long in_RCX;
  void *in_RDX;
  char *pcVar10;
  undefined8 uVar11;
  undefined4 *in_R8;
  undefined8 in_R9;
  undefined4 *puVar12;
  void *pvVar13;
  undefined4 uVar14;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list VarArg;
  float FltVal;
  int IntVal;
  double DblVal;
  int64_t LngVal;
  void **local_120;
  float local_108;
  undefined4 local_104;
  double local_100;
  undefined4 local_f8 [2];
  undefined4 *local_f0;
  void *local_e8 [3];
  long local_d0;
  undefined4 *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (KwdCod < 0) {
    KwdCod = -KwdCod;
    puVar12 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar14 = 5;
  }
  else {
    puVar12 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar14 = *puVar12;
  }
  iVar3 = 0;
  if (0xffffff0f < KwdCod - 0xf1U) {
    __env = (__jmp_buf_tag *)(MshIdx + 0x48);
    local_e8[2] = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    iVar2 = _setjmp(__env);
    lVar6 = local_d0;
    pvVar13 = local_e8[2];
    iVar3 = 0;
    if (iVar2 == 0) {
      local_120 = &VarArg[0].overflow_arg_area;
      uVar9 = 0x10;
      switch(uVar14) {
      case 1:
      case 2:
      case 4:
        if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
          if (0 < (int)puVar12[3]) {
            lVar6 = 0;
            do {
              cVar1 = *(char *)((long)puVar12 + lVar6 + 0xfd8);
              if (cVar1 == 'c') {
                uVar4 = (ulong)uVar9;
                if (uVar4 < 0x29) {
                  uVar9 = uVar9 + 8;
                  ppvVar7 = (void **)((long)local_e8 + uVar4);
                }
                else {
                  ppvVar7 = local_120;
                  local_120 = local_120 + 1;
                }
                sVar5 = fread(*ppvVar7,4,0x40,*(FILE **)(MshIdx + 0x300410));
                if (sVar5 != 0x40) {
                  longjmp(__env,-3);
                }
              }
              else if (cVar1 == 'i') {
                if (3 < *(int *)(MshIdx + 4)) goto LAB_00107dd4;
LAB_00107df1:
                uVar4 = (ulong)uVar9;
                if (uVar9 < 0x29) {
                  uVar9 = uVar9 + 8;
                  ppvVar7 = (void **)((long)local_e8 + uVar4);
                }
                else {
                  ppvVar7 = local_120;
                  local_120 = local_120 + 1;
                }
                ScaWrd((GmfMshSct *)MshIdx,*ppvVar7);
              }
              else if (cVar1 == 'r') {
                if (*(int *)(MshIdx + 0x18) == 0x20) goto LAB_00107df1;
LAB_00107dd4:
                uVar4 = (ulong)uVar9;
                if (uVar9 < 0x29) {
                  uVar9 = uVar9 + 8;
                  ppvVar7 = (void **)((long)local_e8 + uVar4);
                }
                else {
                  ppvVar7 = local_120;
                  local_120 = local_120 + 1;
                }
                ScaDblWrd((GmfMshSct *)MshIdx,*ppvVar7);
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)puVar12[3]);
          }
        }
        else if (0 < (int)puVar12[3]) {
          lVar6 = 0;
          do {
            cVar1 = *(char *)((long)puVar12 + lVar6 + 0xfd8);
            if (cVar1 == 'c') {
              uVar4 = (ulong)uVar9;
              if (uVar4 < 0x29) {
                uVar9 = uVar9 + 8;
                ppvVar7 = (void **)((long)local_e8 + uVar4);
              }
              else {
                ppvVar7 = local_120;
                local_120 = local_120 + 1;
              }
              pcVar10 = fgets((char *)*ppvVar7,0x40,*(FILE **)(MshIdx + 0x300410));
              if (pcVar10 == (char *)0x0) {
                longjmp(__env,-2);
              }
            }
            else if (cVar1 == 'i') {
              uVar11 = *(undefined8 *)(MshIdx + 0x300410);
              uVar4 = (ulong)uVar9;
              if (*(int *)(MshIdx + 4) < 4) {
                if (uVar9 < 0x29) {
                  uVar9 = uVar9 + 8;
                  ppvVar7 = (void **)((long)local_e8 + uVar4);
                }
                else {
                  ppvVar7 = local_120;
                  local_120 = local_120 + 1;
                }
                pvVar13 = *ppvVar7;
                pcVar10 = "%d";
              }
              else {
                if (uVar9 < 0x29) {
                  uVar9 = uVar9 + 8;
                  ppvVar7 = (void **)((long)local_e8 + uVar4);
                }
                else {
                  ppvVar7 = local_120;
                  local_120 = local_120 + 1;
                }
                pvVar13 = *ppvVar7;
                pcVar10 = "%ld";
              }
LAB_00108013:
              iVar3 = __isoc99_fscanf(uVar11,pcVar10,pvVar13);
              if (iVar3 != 1) goto LAB_00108415;
            }
            else if (cVar1 == 'r') {
              if (*(int *)(MshIdx + 0x18) != 0x20) {
                uVar4 = (ulong)uVar9;
                if (uVar4 < 0x29) {
                  uVar9 = uVar9 + 8;
                  ppvVar7 = (void **)((long)local_e8 + uVar4);
                }
                else {
                  ppvVar7 = local_120;
                  local_120 = local_120 + 1;
                }
                pvVar13 = *ppvVar7;
                uVar11 = *(undefined8 *)(MshIdx + 0x300410);
                pcVar10 = "%lf";
                goto LAB_00108013;
              }
              iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%f",&local_108);
              if (iVar3 != 1) {
LAB_00108415:
                longjmp(__env,-1);
              }
              uVar4 = (ulong)uVar9;
              if (uVar4 < 0x29) {
                uVar9 = uVar9 + 8;
                ppvVar7 = (void **)((long)local_e8 + uVar4);
              }
              else {
                ppvVar7 = local_120;
                local_120 = local_120 + 1;
              }
              *(float *)*ppvVar7 = local_108;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < (int)puVar12[3]);
        }
        break;
      case 3:
        if (*(int *)(MshIdx + 0x18) == 0x20) {
          if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
            if (0 < (int)puVar12[3]) {
              lVar6 = 0;
              do {
                ScaWrd((GmfMshSct *)MshIdx,pvVar13);
                lVar6 = lVar6 + 1;
                pvVar13 = (void *)((long)pvVar13 + 4);
              } while (lVar6 < (int)puVar12[3]);
            }
          }
          else if (0 < (int)puVar12[3]) {
            lVar6 = 0;
            do {
              iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%f",pvVar13);
              if (iVar3 != 1) goto LAB_00108415;
              lVar6 = lVar6 + 1;
              pvVar13 = (void *)((long)pvVar13 + 4);
            } while (lVar6 < (int)puVar12[3]);
          }
        }
        else if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
          if (0 < (int)puVar12[3]) {
            lVar6 = 0;
            do {
              ScaDblWrd((GmfMshSct *)MshIdx,pvVar13);
              lVar6 = lVar6 + 1;
              pvVar13 = (void *)((long)pvVar13 + 8);
            } while (lVar6 < (int)puVar12[3]);
          }
        }
        else if (0 < (int)puVar12[3]) {
          lVar6 = 0;
          do {
            iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%lf",pvVar13);
            if (iVar3 != 1) goto LAB_00108415;
            lVar6 = lVar6 + 1;
            pvVar13 = (void *)((long)pvVar13 + 8);
          } while (lVar6 < (int)puVar12[3]);
        }
        break;
      case 5:
        if (0 < (int)puVar12[3]) {
          local_f0 = local_c8;
          lVar8 = 0;
          do {
            cVar1 = *(char *)((long)puVar12 + lVar8 + 0xfd8);
            if (cVar1 == 'r') {
              if (*(int *)(MshIdx + 0x18) == 0x20) {
                if ((*(uint *)(MshIdx + 0xc) & 1) == 0) {
                  ScaWrd((GmfMshSct *)MshIdx,&local_108);
                }
                else {
                  iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%f",&local_108);
                  if (iVar3 != 1) goto LAB_00108415;
                }
                local_100 = (double)local_108;
              }
              else if ((*(uint *)(MshIdx + 0xc) & 1) == 0) {
                ScaDblWrd((GmfMshSct *)MshIdx,&local_100);
              }
              else {
                iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%lf",&local_100);
                if (iVar3 != 1) goto LAB_00108415;
              }
              *(double *)(lVar6 + lVar8 * 8) = local_100;
            }
            else if (cVar1 == 'i') {
              if (*(int *)(MshIdx + 4) < 4) {
                if ((*(uint *)(MshIdx + 0xc) & 1) == 0) {
                  ScaWrd((GmfMshSct *)MshIdx,&local_104);
                }
                else {
                  iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%d",&local_104);
                  if (iVar3 != 1) goto LAB_00108415;
                }
              }
              else {
                if ((*(uint *)(MshIdx + 0xc) & 1) == 0) {
                  ScaDblWrd((GmfMshSct *)MshIdx,local_f8);
                }
                else {
                  iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%ld",local_f8);
                  if (iVar3 != 1) goto LAB_00108415;
                }
                local_104 = local_f8[0];
              }
              if ((""[(uint)KwdCod] == '\0') || (lVar8 < (long)(int)puVar12[3] + -1)) {
                *(undefined4 *)((long)pvVar13 + lVar8 * 4) = local_104;
              }
              else {
                *local_f0 = local_104;
              }
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)puVar12[3]);
        }
      }
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int GmfGetLin(int64_t MshIdx, int KwdCod, ...)
{
   int         i, err, typ, *IntTab, *RefPtr, IntVal;
   int64_t     LngVal;
   float       *FltSolTab, FltVal, *PtrFlt;
   double      *DblSolTab, *PtrDbl, *DblTab, DblVal;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   // Special trick: if the kwd is negative the call come from Fortran
   if(KwdCod < 0)
   {
      // Set Fortran mode ON
      KwdCod = -KwdCod;
      kwd = &msh->KwdTab[ KwdCod ];
      typ = F77Kwd;
   }
   else
   {
      kwd = &msh->KwdTab[ KwdCod ];
      typ = kwd->typ;
   }

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Start decoding the arguments
   va_start(VarArg, KwdCod);

   switch(typ)
   {
      case InfKwd : case RegKwd : case CmtKwd :
      {
         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     safe_fscanf(msh->hdl, "%f", &FltVal, msh->err);
                     PtrDbl = va_arg(VarArg, double *);
                     PtrFlt = (float *)PtrDbl;
                     *PtrFlt = FltVal;
                  }                     
                  else
                  {
                     PtrDbl = va_arg(VarArg, double *);
                     safe_fscanf(msh->hdl, "%lf",PtrDbl, msh->err);
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     safe_fscanf(msh->hdl, "%d",
                        va_arg(VarArg, int *), msh->err);
                  }
                  else
                  {
                     // [Bruno] %ld -> INT64_T_FMT
                     safe_fscanf(msh->hdl, INT64_T_FMT,
                              va_arg(VarArg, int64_t *), msh->err);
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  safe_fgets(va_arg(VarArg, char *), FilStrSiz, msh->hdl, msh->err);
               }
            }
         }
         else
         {
            for(i=0;i<kwd->SolSiz;i++)
               if(kwd->fmt[i] == 'r')
                  if(msh->FltSiz == 32)
                     ScaWrd(msh, (unsigned char *)va_arg(VarArg, float *));
                  else
                     ScaDblWrd(msh, (unsigned char *)va_arg(VarArg, double *));
               else if(kwd->fmt[i] == 'i')
                  if(msh->ver <= 3)
                     ScaWrd(msh, (unsigned char *)va_arg(VarArg, int *));
                  else
                     ScaDblWrd(msh, (unsigned char *)va_arg(VarArg, int64_t *));
               else if(kwd->fmt[i] == 'c')
                  // [Bruno] added error control
                  safe_fread(va_arg(VarArg, char *), WrdSiz, FilStrSiz, msh->hdl, msh->err);
         }
      }break;

      case SolKwd :
      {
         if(msh->FltSiz == 32)
         {
            FltSolTab = va_arg(VarArg, float *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  safe_fscanf(msh->hdl, "%f", &FltSolTab[i], msh->err);
            else
               for(i=0; i<kwd->SolSiz; i++)
                  ScaWrd(msh, (unsigned char *)&FltSolTab[i]);
         }
         else
         {
            DblSolTab = va_arg(VarArg, double *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  safe_fscanf(msh->hdl, "%lf", &DblSolTab[i], msh->err);
            else
               for(i=0; i<kwd->SolSiz; i++)
                  ScaDblWrd(msh, (unsigned char *)&DblSolTab[i]);
         }
      }break;

      case F77Kwd :
      {
         IntTab = va_arg(VarArg, int *);
         DblTab = va_arg(VarArg, double *);
         RefPtr = va_arg(VarArg, int *);

         for(i=0;i<kwd->SolSiz;i++)
         {
            if(kwd->fmt[i] == 'i')
            {
               if(msh->ver <= 3)
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%d", &IntVal, msh->err);
                  else
                     ScaWrd(msh, (unsigned char *)&IntVal);
               }
               else
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, INT64_T_FMT, &LngVal, msh->err);
                  else
                     ScaDblWrd(msh, (unsigned char *)&LngVal);

                  IntVal = (int)LngVal;
               }

               if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                  IntTab[i] = IntVal;
               else
                  *RefPtr = IntVal;
            }
            else if(kwd->fmt[i] == 'r')
            {
               if(msh->FltSiz == 32)
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%f", &FltVal, msh->err);
                  else
                     ScaWrd(msh, (unsigned char *)&FltVal);

                  DblVal = (double)FltVal;
               }
               else
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%lf", &DblVal, msh->err);
                  else
                     ScaDblWrd(msh, (unsigned char *)&DblVal);
               }

               DblTab[i] = DblVal;
            }
         }
      }break;
   }

   va_end(VarArg);

   return(1);
}